

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.hpp
# Opt level: O0

void __thiscall Omega_h::Library::Library(Library *this,int *argc,char ***argv)

{
  char ***argv_local;
  int *argc_local;
  Library *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->argv_);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&this->world_);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&this->self_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::map(&this->timers);
  Omega_h::Library::initialize
            ((char *)this,(int *)"9.34.13-sha.dc235450+00000010000000001",(char ***)argc);
  return;
}

Assistant:

inline Library(int* argc, char*** argv
#ifdef OMEGA_H_USE_MPI
      ,
      MPI_Comm comm_mpi = MPI_COMM_WORLD
#endif
  ) {
    initialize(OMEGA_H_SEMVER, argc, argv
#ifdef OMEGA_H_USE_MPI
        ,
        comm_mpi
#endif
    );
  }